

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O1

psa_status_t psa_hash_update(psa_hash_operation_t *operation,uint8_t *input,size_t input_length)

{
  int ret;
  psa_status_t pVar1;
  
  if (input_length != 0) {
    pVar1 = -0x89;
    switch(operation->alg) {
    case 0x1000003:
      ret = mbedtls_md5_update_ret(&(operation->ctx).md5,input,input_length);
      break;
    case 0x1000004:
      ret = mbedtls_ripemd160_update_ret(&(operation->ctx).ripemd160,input,input_length);
      break;
    case 0x1000005:
      ret = mbedtls_sha1_update_ret(&(operation->ctx).sha1,input,input_length);
      break;
    default:
      goto switchD_00128b34_caseD_1000006;
    case 0x1000008:
    case 0x1000009:
      ret = mbedtls_sha256_update_ret(&(operation->ctx).sha256,input,input_length);
      break;
    case 0x100000a:
    case 0x100000b:
      ret = mbedtls_sha512_update_ret(&(operation->ctx).sha512,input,input_length);
    }
    if (ret != 0) {
      psa_hash_abort(operation);
    }
    pVar1 = mbedtls_to_psa_error(ret);
    return pVar1;
  }
  pVar1 = 0;
switchD_00128b34_caseD_1000006:
  return pVar1;
}

Assistant:

psa_status_t psa_hash_update( psa_hash_operation_t *operation,
                              const uint8_t *input,
                              size_t input_length )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    /* Don't require hash implementations to behave correctly on a
     * zero-length input, which may have an invalid pointer. */
    if( input_length == 0 )
        return( PSA_SUCCESS );

    switch( operation->alg )
    {
#if defined(MBEDTLS_MD2_C)
        case PSA_ALG_MD2:
            ret = mbedtls_md2_update_ret( &operation->ctx.md2,
                                          input, input_length );
            break;
#endif
#if defined(MBEDTLS_MD4_C)
        case PSA_ALG_MD4:
            ret = mbedtls_md4_update_ret( &operation->ctx.md4,
                                          input, input_length );
            break;
#endif
#if defined(MBEDTLS_MD5_C)
        case PSA_ALG_MD5:
            ret = mbedtls_md5_update_ret( &operation->ctx.md5,
                                          input, input_length );
            break;
#endif
#if defined(MBEDTLS_RIPEMD160_C)
        case PSA_ALG_RIPEMD160:
            ret = mbedtls_ripemd160_update_ret( &operation->ctx.ripemd160,
                                                input, input_length );
            break;
#endif
#if defined(MBEDTLS_SHA1_C)
        case PSA_ALG_SHA_1:
            ret = mbedtls_sha1_update_ret( &operation->ctx.sha1,
                                           input, input_length );
            break;
#endif
#if defined(MBEDTLS_SHA256_C)
        case PSA_ALG_SHA_224:
        case PSA_ALG_SHA_256:
            ret = mbedtls_sha256_update_ret( &operation->ctx.sha256,
                                             input, input_length );
            break;
#endif
#if defined(MBEDTLS_SHA512_C)
#if !defined(MBEDTLS_SHA512_NO_SHA384)
        case PSA_ALG_SHA_384:
#endif
        case PSA_ALG_SHA_512:
            ret = mbedtls_sha512_update_ret( &operation->ctx.sha512,
                                             input, input_length );
            break;
#endif
        default:
            return( PSA_ERROR_BAD_STATE );
    }

    if( ret != 0 )
        psa_hash_abort( operation );
    return( mbedtls_to_psa_error( ret ) );
}